

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O3

void anon_unknown.dwarf_34db32::wavEncodeDecode
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny)

{
  ushort *puVar1;
  ulong uVar2;
  unsigned_short *puVar3;
  ushort uVar4;
  ushort *puVar5;
  unsigned_short *puVar6;
  ulong uVar7;
  
  puVar1 = a->_data;
  if (ny < 1) {
    Imf_3_4::wav2Encode(puVar1,nx,1,ny,nx,0);
    Imf_3_4::wav2Decode(a->_data,nx,1,ny,nx,0);
    return;
  }
  uVar2 = 0;
  uVar4 = 0;
  puVar5 = puVar1;
  do {
    if (0 < nx) {
      uVar7 = 0;
      do {
        if (uVar4 <= puVar5[uVar7]) {
          uVar4 = puVar5[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while ((uint)nx != uVar7);
    }
    uVar2 = uVar2 + 1;
    puVar5 = puVar5 + a->_sizeY;
  } while (uVar2 != (uint)ny);
  Imf_3_4::wav2Encode(puVar1,nx,1,ny,nx,uVar4);
  Imf_3_4::wav2Decode(a->_data,nx,1,ny,nx,uVar4);
  if (0 < ny) {
    puVar3 = a->_data;
    puVar6 = b->_data;
    uVar2 = 0;
    do {
      if (0 < nx) {
        uVar7 = 0;
        do {
          if (puVar3[uVar7] != puVar6[uVar7]) {
            __assert_fail("a[y][x] == b[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testWav.cpp"
                          ,0x9b,
                          "void (anonymous namespace)::wavEncodeDecode(Array2D<unsigned short> &, const Array2D<unsigned short> &, int, int)"
                         );
          }
          uVar7 = uVar7 + 1;
        } while ((uint)nx != uVar7);
      }
      uVar2 = uVar2 + 1;
      puVar6 = puVar6 + b->_sizeY;
      puVar3 = puVar3 + a->_sizeY;
    } while (uVar2 != (uint)ny);
  }
  return;
}

Assistant:

void
wavEncodeDecode (
    Array2D<unsigned short>&       a,
    const Array2D<unsigned short>& b,
    int                            nx,
    int                            ny)
{
    unsigned short mx = maxValue (a, nx, ny);

    //cout << "encoding " << flush;

    wav2Encode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "decoding " << flush;

    wav2Decode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "comparing" << endl;

    for (int y = 0; y < ny; ++y)
    {
        for (int x = 0; x < nx; ++x)
        {
            //cout << x << ' ' << y << ' ' << a[y][x] << ' ' << b[y][x] << endl;
            assert (a[y][x] == b[y][x]);
        }
    }
}